

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteToConsoleListener.cpp
# Opt level: O2

shared_ptr<Common::WriteToConsoleListener> Common::WriteToConsoleListener::instance(void)

{
  int iVar1;
  WriteToConsoleListener *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<Common::WriteToConsoleListener> sVar2;
  
  if (instance()::inst == '\0') {
    iVar1 = __cxa_guard_acquire(&instance()::inst);
    if (iVar1 != 0) {
      __p = (WriteToConsoleListener *)operator_new(0x30);
      (__p->super_Listener)._vptr_Listener = (_func_int **)&PTR__WriteToConsoleListener_00106cf8;
      (__p->_mutex).super___mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(__p->_mutex).super___mutex_base._M_mutex + 8) = 0;
      *(undefined8 *)((long)&(__p->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
      (__p->_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      (__p->_mutex).super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      std::__shared_ptr<Common::WriteToConsoleListener,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Common::WriteToConsoleListener,void>
                ((__shared_ptr<Common::WriteToConsoleListener,(__gnu_cxx::_Lock_policy)2> *)
                 &instance::inst,__p);
      __cxa_atexit(std::__shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&instance::inst,&__dso_handle);
      __cxa_guard_release(&instance()::inst);
    }
  }
  std::__shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2> *)in_RDI,
             &instance::inst.
              super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>);
  sVar2.super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<Common::WriteToConsoleListener>)
         sVar2.super___shared_ptr<Common::WriteToConsoleListener,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<WriteToConsoleListener> WriteToConsoleListener::instance()
{
    static auto inst = std::shared_ptr<WriteToConsoleListener>(new WriteToConsoleListener);
    return inst;
}